

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O2

Symbol * __thiscall slang::ast::ASTContext::getContainingSymbol(ASTContext *this)

{
  SubroutineSymbol *pSVar1;
  
  pSVar1 = (SubroutineSymbol *)this->instanceOrProc;
  if ((pSVar1 == (SubroutineSymbol *)0x0) || ((pSVar1->super_Symbol).kind != ProceduralBlock)) {
    pSVar1 = getContainingSubroutine(this);
    if (pSVar1 == (SubroutineSymbol *)0x0) {
      pSVar1 = (SubroutineSymbol *)((this->scope).ptr)->thisSym;
    }
  }
  return &pSVar1->super_Symbol;
}

Assistant:

const Symbol& ASTContext::getContainingSymbol() const {
    const Symbol* containingSym = getProceduralBlock();
    if (!containingSym)
        containingSym = getContainingSubroutine();

    if (!containingSym)
        containingSym = &scope->asSymbol();

    return *containingSym;
}